

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O3

shared_ptr<aeron::Subscription> __thiscall
aeron::ClientConductor::findSubscription(ClientConductor *this,int64_t registrationId)

{
  char *pcVar1;
  undefined4 uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 auVar3 [16];
  int iVar4;
  long *plVar5;
  SourcedException *pSVar6;
  char *pcVar7;
  SourcedException *pSVar8;
  _func_int **pp_Var9;
  pointer in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar10;
  char *pcVar11;
  long lVar12;
  SourcedException *unaff_R15;
  shared_ptr<aeron::Subscription> sVar13;
  undefined1 auVar14 [16];
  allocator local_d1;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)(registrationId + 8));
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
    goto LAB_001602cd;
  }
  unaff_R15 = *(SourcedException **)(registrationId + 0x60);
  pSVar6 = *(SourcedException **)(registrationId + 0x68);
  lVar12 = (long)pSVar6 - (long)unaff_R15;
  lVar10 = (lVar12 >> 6) * -0x5555555555555555 >> 2;
  if (0 < lVar10) {
    pSVar8 = (SourcedException *)(lVar10 * 0x300 + (long)unaff_R15);
    lVar10 = lVar10 + 1;
    unaff_R15 = (SourcedException *)&unaff_R15[5].m_where.field_2;
    do {
      if (unaff_R15[-5].m_where._M_dataplus._M_p == in_RDX) {
        unaff_R15 = (SourcedException *)&unaff_R15[-6].m_what._M_string_length;
        goto LAB_001601a9;
      }
      if ((pointer)unaff_R15[-3].m_what.field_2._M_allocated_capacity == in_RDX) {
        unaff_R15 = (SourcedException *)&unaff_R15[-3].m_where.field_2;
        goto LAB_001601a9;
      }
      if (*(pointer *)((long)&(unaff_R15->m_where).field_2 + 8) == in_RDX) goto LAB_001601a9;
      if (unaff_R15[3].m_where._M_dataplus._M_p == in_RDX) {
        unaff_R15 = (SourcedException *)&unaff_R15[2].m_what._M_string_length;
        goto LAB_001601a9;
      }
      lVar10 = lVar10 + -1;
      unaff_R15 = (SourcedException *)&unaff_R15[10].m_what._M_string_length;
    } while (1 < lVar10);
    lVar12 = (long)pSVar6 - (long)pSVar8;
    unaff_R15 = pSVar8;
  }
  lVar10 = (lVar12 >> 6) * -0x5555555555555555;
  if (lVar10 == 1) {
LAB_00160183:
    if (*(pointer *)((long)&(unaff_R15->m_where).field_2 + 8) != in_RDX) {
      unaff_R15 = pSVar6;
    }
LAB_001601a9:
    if (unaff_R15 != pSVar6) {
      std::__shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2> *)this,
                 &unaff_R15[1].m_what);
      if (unaff_R15[1].m_where.field_2._M_allocated_capacity != 0) {
        this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ((long)&unaff_R15[1].m_where.field_2 + 8);
        unaff_R15[1].m_where.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&unaff_R15[1].m_where.field_2 + 8) = 0;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
      }
      pp_Var9 = this->_vptr_ClientConductor;
      iVar4 = *(int *)&(unaff_R15->m_what).field_2;
      if ((pp_Var9 == (_func_int **)0x0) && (iVar4 == 0)) {
        if (*(long *)(registrationId + 0x1e8) == 0) {
          auVar14 = std::__throw_bad_function_call();
        }
        else {
          lVar10 = (**(code **)(registrationId + 0x1f0))(registrationId + 0x1d8);
          if (lVar10 <= (long)(*(long *)(registrationId + 0x210) +
                              (unaff_R15->m_what)._M_string_length)) goto LAB_001602a9;
          unaff_R15 = (SourcedException *)__cxa_allocate_exception(0x48);
          std::__cxx11::to_string(&local_70,*(long *)(registrationId + 0x210));
          std::operator+(&local_b0,"no response from driver in ",&local_70);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
          auVar3._8_8_ = &local_d0.field_2;
          auVar3._0_8_ = plVar5;
          auVar14._8_8_ = (_func_int **)*plVar5;
          auVar14._0_8_ = plVar5;
          pp_Var9 = (_func_int **)(plVar5 + 2);
          if ((_func_int **)*plVar5 == pp_Var9) {
            local_d0.field_2._M_allocated_capacity = (size_type)*pp_Var9;
            local_d0.field_2._8_4_ = (undefined4)plVar5[3];
            local_d0.field_2._12_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
            auVar14 = auVar3;
            goto LAB_001603a3;
          }
        }
        local_d0.field_2._M_allocated_capacity = (size_type)*pp_Var9;
LAB_001603a3:
        local_d0._M_dataplus._M_p = auVar14._8_8_;
        plVar5 = auVar14._0_8_;
        local_d0._M_string_length = plVar5[1];
        *plVar5 = (long)pp_Var9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,
                   "std::shared_ptr<Subscription> aeron::ClientConductor::findSubscription(std::int64_t)"
                   ,"");
        pcVar11 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ClientConductor.cpp"
        ;
        pcVar7 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
        do {
          pcVar7 = pcVar7 + 1;
          pcVar1 = pcVar11 + 1;
          pcVar11 = pcVar11 + 1;
        } while (*pcVar7 == *pcVar1);
        std::__cxx11::string::string((string *)&local_50,pcVar11 + (*pcVar1 == '/'),&local_d1);
        util::SourcedException::SourcedException(unaff_R15,&local_d0,&local_90,&local_50,0x10f);
        *(undefined ***)unaff_R15 = &PTR__SourcedException_001866f0;
        __cxa_throw(unaff_R15,&util::DriverTimeoutException::typeinfo,
                    util::SourcedException::~SourcedException);
      }
      if ((pp_Var9 == (_func_int **)0x0) && (iVar4 == 2)) {
LAB_001602cd:
        pSVar6 = (SourcedException *)__cxa_allocate_exception(0x50);
        uVar2 = *(undefined4 *)((long)&(unaff_R15->m_what).field_2 + 4);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,
                   "std::shared_ptr<Subscription> aeron::ClientConductor::findSubscription(std::int64_t)"
                   ,"");
        pcVar11 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ClientConductor.cpp"
        ;
        pcVar7 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
        do {
          pcVar7 = pcVar7 + 1;
          pcVar1 = pcVar11 + 1;
          pcVar11 = pcVar11 + 1;
        } while (*pcVar7 == *pcVar1);
        std::__cxx11::string::string
                  ((string *)&local_b0,pcVar11 + (*pcVar1 == '/'),(allocator *)&local_70);
        util::SourcedException::SourcedException
                  (pSVar6,(string *)((long)&(unaff_R15->m_what).field_2 + 8),&local_d0,&local_b0,
                   0x114);
        *(undefined ***)pSVar6 = &PTR__SourcedException_00186980;
        *(undefined4 *)(pSVar6 + 1) = uVar2;
        __cxa_throw(pSVar6,&util::RegistrationException::typeinfo,
                    util::SourcedException::~SourcedException);
      }
      goto LAB_001602a9;
    }
  }
  else {
    if (lVar10 == 2) {
LAB_00160176:
      if (*(pointer *)((long)&(unaff_R15->m_where).field_2 + 8) != in_RDX) {
        unaff_R15 = (SourcedException *)&unaff_R15[2].m_what._M_string_length;
        goto LAB_00160183;
      }
      goto LAB_001601a9;
    }
    if (lVar10 == 3) {
      if (*(pointer *)((long)&(unaff_R15->m_where).field_2 + 8) != in_RDX) {
        unaff_R15 = (SourcedException *)&unaff_R15[2].m_what._M_string_length;
        goto LAB_00160176;
      }
      goto LAB_001601a9;
    }
  }
  this->_vptr_ClientConductor = (_func_int **)0x0;
  (this->m_adminLock).super___recursive_mutex_base._M_mutex.__align = 0;
LAB_001602a9:
  pthread_mutex_unlock((pthread_mutex_t *)(registrationId + 8));
  sVar13.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar13.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<aeron::Subscription>)
         sVar13.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Subscription> ClientConductor::findSubscription(std::int64_t registrationId)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto it = std::find_if(m_subscriptions.begin(), m_subscriptions.end(),
        [registrationId](const SubscriptionStateDefn &entry)
        {
            return registrationId == entry.m_registrationId;
        });

    if (it == m_subscriptions.end())
    {
        return std::shared_ptr<Subscription>();
    }

    SubscriptionStateDefn& state = *it;
    std::shared_ptr<Subscription> sub = state.m_subscription.lock();

    // now remove the cached value
    if (state.m_subscriptionCache)
    {
        state.m_subscriptionCache.reset();
    }

    if (!sub && RegistrationStatus::AWAITING_MEDIA_DRIVER == state.m_status)
    {
        if (m_epochClock() > (state.m_timeOfRegistration + m_driverTimeoutMs))
        {
            throw DriverTimeoutException(
                "no response from driver in " +  std::to_string(m_driverTimeoutMs) + " ms", SOURCEINFO);
        }
    }
    else if (!sub && RegistrationStatus::ERRORED_MEDIA_DRIVER == state.m_status)
    {
        throw RegistrationException(state.m_errorCode, state.m_errorMessage, SOURCEINFO);
    }

    return sub;
}